

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadSource(ColladaParser *this)

{
  _func_int *p_Var1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  string sourceID;
  string local_70;
  string local_50;
  
  uVar2 = GetAttribute(this,"id");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
  std::__cxx11::string::string
            ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar3),(allocator *)&local_70);
LAB_0040919c:
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar3 == '\0') {
LAB_00409323:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return;
  }
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  p_Var1 = this->mReader->_vptr_IIrrXMLReader[3];
  if (iVar3 != 1) {
    iVar3 = (*p_Var1)();
    if (iVar3 == 2) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_05,iVar3),"source");
      if (iVar3 == 0) goto LAB_00409323;
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_06,iVar3),"technique_common");
      if (iVar3 != 0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Expected end of <source> element.","");
        ThrowException(this,&local_70);
      }
    }
    goto LAB_0040919c;
  }
  iVar3 = (*p_Var1)();
  if (iVar3 != 1) goto LAB_00409345;
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"float_array");
  if (iVar3 != 0) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 != 1) goto LAB_00409345;
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"IDREF_array");
    if (iVar3 != 0) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"Name_array");
        if (iVar3 == 0) goto LAB_00409304;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 == 1) {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"technique_common");
          if (iVar3 != 0) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 != 1) goto LAB_00409345;
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"accessor");
            if (iVar3 == 0) {
              ReadAccessor(this,&local_50);
            }
            else {
              SkipElement(this);
            }
          }
          goto LAB_0040919c;
        }
      }
LAB_00409345:
      __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                    ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
    }
  }
LAB_00409304:
  ReadDataArray(this);
  goto LAB_0040919c;
}

Assistant:

void ColladaParser::ReadSource()
{
    int indexID = GetAttribute("id");
    std::string sourceID = mReader->getAttributeValue(indexID);

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("float_array") || IsElement("IDREF_array") || IsElement("Name_array"))
            {
                ReadDataArray();
            }
            else if (IsElement("technique_common"))
            {
                // I don't care for your profiles
            }
            else if (IsElement("accessor"))
            {
                ReadAccessor(sourceID);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "source") == 0)
            {
                // end of <source> - we're done
                break;
            }
            else if (strcmp(mReader->getNodeName(), "technique_common") == 0)
            {
                // end of another meaningless element - read over it
            }
            else
            {
                // everything else should be punished
                ThrowException("Expected end of <source> element.");
            }
        }
    }
}